

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O3

void PrintCall(OutputContext *ctx,char *constantData,uint microcodePos)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  int *piVar7;
  char *pcVar8;
  
  Print(ctx,"(");
  iVar1 = *(int *)(constantData + (ulong)microcodePos * 4);
  piVar5 = (int *)(constantData + (ulong)microcodePos * 4);
  while (piVar7 = piVar5, iVar1 != 1) {
    switch(iVar1) {
    case 2:
      uVar6 = (ulong)(uint)piVar5[1];
      pcVar8 = "r%d~";
      break;
    case 3:
      uVar6 = (ulong)(uint)piVar5[1];
      pcVar8 = "r%d";
      break;
    case 4:
      uVar6 = (ulong)(uint)piVar5[1];
      pcVar8 = "%d";
      break;
    case 5:
      uVar6 = (ulong)(uint)piVar5[1];
      pcVar8 = "%dL";
      break;
    case 6:
      iVar1 = piVar5[1];
      piVar7 = piVar5 + 4;
      uVar3 = piVar5[2];
      uVar2 = piVar5[3];
      Print(ctx,"[");
      PrintRegister(ctx,(uchar)iVar1);
      Print(ctx," + 0x%x] x%d",(ulong)uVar3,(ulong)uVar2);
      goto LAB_0018f8b7;
    default:
      __assert_fail("!\"unknown micro instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0xaf,"void PrintCall(OutputContext &, char *, unsigned int)");
    }
    piVar7 = piVar5 + 2;
    Print(ctx,pcVar8,uVar6);
LAB_0018f8b7:
    if (*piVar7 == 1) break;
    Print(ctx,", ");
    piVar5 = piVar7;
    iVar1 = *piVar7;
  }
  Print(ctx,") -> ");
  uVar3 = piVar7[2];
  if (5 < uVar3) {
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                  ,0xd2,"void PrintCall(OutputContext &, char *, unsigned int)");
  }
  switch(uVar3) {
  case 0:
    pcVar8 = "void";
    break;
  case 1:
    pcVar8 = "double (r%d";
    goto LAB_0018f93b;
  case 2:
    pcVar8 = "long (r%d";
    goto LAB_0018f93b;
  case 3:
    pcVar8 = "int (r%d";
LAB_0018f93b:
    Print(ctx,pcVar8,(ulong)(uint)piVar7[1]);
    goto LAB_0018f958;
  case 4:
    pcVar8 = "struct (";
    break;
  case 5:
    pcVar8 = "error";
  }
  Print(ctx,pcVar8,(ulong)(uint)piVar7[1]);
LAB_0018f958:
  iVar1 = piVar7[3];
  piVar5 = piVar7 + 3;
  while (iVar1 != 7) {
    if (iVar1 == 10) {
      iVar1 = piVar5[1];
      piVar7 = piVar5 + 4;
      uVar2 = piVar5[2];
      uVar4 = piVar5[3];
      Print(ctx,"[");
      PrintRegister(ctx,(uchar)iVar1);
      Print(ctx," + 0x%x] x%d",(ulong)uVar2,(ulong)uVar4);
    }
    else {
      if (iVar1 == 9) {
        uVar2 = piVar5[1];
        pcVar8 = "r%d";
      }
      else {
        if (iVar1 != 8) {
          __assert_fail("!\"unknown micro instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                        ,0xeb,"void PrintCall(OutputContext &, char *, unsigned int)");
        }
        uVar2 = piVar5[1];
        pcVar8 = "r%d~";
      }
      piVar7 = piVar5 + 2;
      Print(ctx,pcVar8,(ulong)uVar2);
    }
    if (*piVar7 == 7) break;
    Print(ctx,", ");
    piVar5 = piVar7;
    iVar1 = *piVar7;
  }
  pcVar8 = ") @%d";
  if (uVar3 == 0) {
    pcVar8 = " @%d";
  }
  if (uVar3 == 5) {
    pcVar8 = " @%d";
  }
  Print(ctx,pcVar8,(ulong)(microcodePos << 2));
  return;
}

Assistant:

void PrintCall(OutputContext &ctx, char *constantData, unsigned microcodePos)
{
	Print(ctx, "(");

	unsigned *microcode = (unsigned*)constantData + microcodePos;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			Print(ctx, "r%d~", *microcode++);
			break;
		case rvmiPushQword:
			Print(ctx, "r%d", *microcode++);
			break;
		case rvmiPushImm:
			Print(ctx, "%d", *microcode++);
			break;
		case rvmiPushImmq:
			Print(ctx, "%dL", *microcode++);
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			Print(ctx, "[");
			PrintRegister(ctx, (unsigned char)reg);
			Print(ctx, " + 0x%x] x%d", offset, size);
		}
		break;
		default:
			assert(!"unknown micro instruction");
		}

		if(*microcode != rvmiCall)
			Print(ctx, ", ");
	}

	Print(ctx, ") -> ");

	microcode++;

	unsigned targetReg = *microcode++;
	unsigned resultType = *microcode++;

	switch(resultType)
	{
	case rvrVoid:
		Print(ctx, "void");
		break;
	case rvrDouble:
		Print(ctx, "double (r%d", targetReg);
		break;
	case rvrLong:
		Print(ctx, "long (r%d", targetReg);
		break;
	case rvrInt:
		Print(ctx, "int (r%d", targetReg);
		break;
	case rvrStruct:
		Print(ctx, "struct (");
		break;
	case rvrError:
		Print(ctx, "error");
		break;
	default:
		assert(!"unknown type");
	}

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			Print(ctx, "r%d~", *microcode++);
			break;
		case rvmiPopq:
			Print(ctx, "r%d", *microcode++);
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			Print(ctx, "[");
			PrintRegister(ctx, (unsigned char)reg);
			Print(ctx, " + 0x%x] x%d", offset, size);
		}
		break;
		default:
			assert(!"unknown micro instruction");
		}

		if(*microcode != rvmiReturn)
			Print(ctx, ", ");
	}

	if(resultType == rvrVoid || resultType == rvrError)
		Print(ctx, " @%d", microcodePos * 4);
	else
		Print(ctx, ") @%d", microcodePos * 4);
}